

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O2

void __thiscall
HashtableAllTest_InsertValue_Test<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_InsertValue_Test<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *this_00;
  bool bVar1;
  nonempty_iterator ppVar2;
  pair<const_int,_int> pVar3;
  long lVar4;
  pair<google::BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_bool>
  *ppVar5;
  pair<google::BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_bool>
  *ppVar6;
  pointer ppVar7;
  char *pcVar8;
  char *in_R9;
  sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *this_01;
  bool bVar9;
  byte bVar10;
  AssertHelper local_f0;
  AssertionResult gtest_ar__2;
  AssertHelper local_d8;
  AssertionResult gtest_ar_;
  bool local_80;
  pair<google::BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_bool>
  insert_it;
  
  bVar10 = 0;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  bVar9 = *(size_type *)
           ((long)&(this->
                   super_HashtableAllTest<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   ).
                   super_HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   .ht_.
                   super_BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   .ht_.rep.table + 0x40) ==
          (this->
          super_HashtableAllTest<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ).
          super_HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          .ht_.
          super_BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          .ht_.rep.num_deleted;
  gtest_ar_.success_ = bVar9;
  if (!bVar9) {
    testing::Message::Message((Message *)&gtest_ar__2);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&insert_it,(internal *)&gtest_ar_,(AssertionResult *)"this->ht_.empty()",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x376,(char *)CONCAT71(insert_it.first.super_iterator.ht._1_7_,
                                       (char)insert_it.first.super_iterator.ht));
    testing::internal::AssertHelper::operator=(&local_f0,(Message *)&gtest_ar__2);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    std::__cxx11::string::~string((string *)&insert_it);
    if (gtest_ar__2._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar__2._0_8_ + 8))();
    }
  }
  this_00 = &(this->
             super_HashtableAllTest<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ).
             super_HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             .ht_;
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  gtest_ar_._0_8_ = UniqueObjectHelper<std::pair<int_const,int>>(1);
  google::
  BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(&insert_it,
           &this_00->
            super_BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           ,(value_type *)&gtest_ar_);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  bVar9 = *(size_type *)
           ((long)&(this->
                   super_HashtableAllTest<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   ).
                   super_HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   .ht_.
                   super_BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   .ht_.rep.table + 0x40) !=
          (this->
          super_HashtableAllTest<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ).
          super_HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          .ht_.
          super_BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          .ht_.rep.num_deleted;
  gtest_ar_.success_ = bVar9;
  if (!bVar9) {
    testing::Message::Message((Message *)&gtest_ar__2);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&insert_it,(internal *)&gtest_ar_,(AssertionResult *)"this->ht_.empty()",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x378,(char *)CONCAT71(insert_it.first.super_iterator.ht._1_7_,
                                       (char)insert_it.first.super_iterator.ht));
    testing::internal::AssertHelper::operator=(&local_f0,(Message *)&gtest_ar__2);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    std::__cxx11::string::~string((string *)&insert_it);
    if (gtest_ar__2._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar__2._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  gtest_ar_._0_8_ = UniqueObjectHelper<std::pair<int_const,int>>(0xb);
  google::
  BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(&insert_it,
           &this_00->
            super_BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           ,(value_type *)&gtest_ar_);
  gtest_ar_._0_8_ = UniqueObjectHelper<std::pair<int_const,int>>(0x6f);
  google::
  BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(&insert_it,
           &this_00->
            super_BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           ,(value_type *)&gtest_ar_);
  gtest_ar_._0_8_ = UniqueObjectHelper<std::pair<int_const,int>>(0x457);
  google::
  BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(&insert_it,
           &this_00->
            super_BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           ,(value_type *)&gtest_ar_);
  gtest_ar_._0_8_ = UniqueObjectHelper<std::pair<int_const,int>>(0x2b67);
  google::
  BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(&insert_it,
           &this_00->
            super_BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           ,(value_type *)&gtest_ar_);
  gtest_ar_._0_8_ = UniqueObjectHelper<std::pair<int_const,int>>(0x1b207);
  google::
  BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(&insert_it,
           &this_00->
            super_BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           ,(value_type *)&gtest_ar_);
  gtest_ar_._0_8_ = UniqueObjectHelper<std::pair<int_const,int>>(0x10f447);
  google::
  BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(&insert_it,
           &this_00->
            super_BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           ,(value_type *)&gtest_ar_);
  gtest_ar_._0_8_ = UniqueObjectHelper<std::pair<int_const,int>>(0xa98ac7);
  google::
  BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(&insert_it,
           &this_00->
            super_BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           ,(value_type *)&gtest_ar_);
  gtest_ar_._0_8_ = UniqueObjectHelper<std::pair<int_const,int>>(0x69f6bc7);
  google::
  BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(&insert_it,
           &this_00->
            super_BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           ,(value_type *)&gtest_ar_);
  gtest_ar__2._0_4_ = 9;
  gtest_ar_._0_8_ =
       *(size_type *)
        ((long)&(this->
                super_HashtableAllTest<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ).
                super_HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                .ht_.
                super_BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                .ht_.rep.table + 0x40) -
       (this->
       super_HashtableAllTest<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
       ).
       super_HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
       .ht_.
       super_BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
       .ht_.rep.num_deleted;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)&insert_it,"9u","this->ht_.size()",(uint *)&gtest_ar__2,
             (unsigned_long *)&gtest_ar_);
  if ((char)insert_it.first.super_iterator.ht == '\0') {
    testing::Message::Message((Message *)&gtest_ar_);
    if (insert_it.first.super_iterator.pos.row_begin._M_current ==
        (sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_Alloc<std::pair<const_int,_int>,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      ppVar7 = (pointer)0xa51563;
    }
    else {
      ppVar7 = (insert_it.first.super_iterator.pos.row_begin._M_current)->group;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x381,(char *)ppVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__2,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2);
    if (gtest_ar_._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&insert_it.first.super_iterator.pos);
  gtest_ar__2._0_4_ = 1;
  pVar3 = UniqueObjectHelper<std::pair<int_const,int>>(1);
  local_f0.data_._0_4_ = pVar3.first;
  this_01 = &(this->
             super_HashtableAllTest<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ).
             super_HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             .ht_.
             super_BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             .ht_;
  gtest_ar_._0_8_ =
       google::
       sparse_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
       ::count<int>(&this_01->rep,(int *)&local_f0);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)&insert_it,"1u","this->ht_.count(this->UniqueKey(1))",(uint *)&gtest_ar__2,
             (unsigned_long *)&gtest_ar_);
  if ((char)insert_it.first.super_iterator.ht == '\0') {
    testing::Message::Message((Message *)&gtest_ar_);
    if (insert_it.first.super_iterator.pos.row_begin._M_current ==
        (sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_Alloc<std::pair<const_int,_int>,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      ppVar7 = (pointer)0xa51563;
    }
    else {
      ppVar7 = (insert_it.first.super_iterator.pos.row_begin._M_current)->group;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x382,(char *)ppVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__2,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2);
    if (gtest_ar_._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&insert_it.first.super_iterator.pos);
  gtest_ar__2._0_4_ = 1;
  pVar3 = UniqueObjectHelper<std::pair<int_const,int>>(0x457);
  local_f0.data_._0_4_ = pVar3.first;
  gtest_ar_._0_8_ =
       google::
       sparse_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
       ::count<int>(&this_01->rep,(int *)&local_f0);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)&insert_it,"1u","this->ht_.count(this->UniqueKey(1111))",
             (uint *)&gtest_ar__2,(unsigned_long *)&gtest_ar_);
  if ((char)insert_it.first.super_iterator.ht == '\0') {
    testing::Message::Message((Message *)&gtest_ar_);
    if (insert_it.first.super_iterator.pos.row_begin._M_current ==
        (sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_Alloc<std::pair<const_int,_int>,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      ppVar7 = (pointer)0xa51563;
    }
    else {
      ppVar7 = (insert_it.first.super_iterator.pos.row_begin._M_current)->group;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,899,(char *)ppVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__2,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2);
    if (gtest_ar_._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&insert_it.first.super_iterator.pos);
  insert_it.first.parent_._0_1_ = 0;
  insert_it._73_8_ = 0;
  insert_it.first.super_iterator.end.row_current._M_current =
       (sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_Alloc<std::pair<const_int,_int>,_unsigned_long,_18446744073709551615UL>_>
        *)0x0;
  insert_it.first.super_iterator.end.col_current._0_1_ = 0;
  insert_it.first.super_iterator.end.col_current._1_7_ = 0;
  insert_it.first.super_iterator.end.row_begin._M_current =
       (sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_Alloc<std::pair<const_int,_int>,_unsigned_long,_18446744073709551615UL>_>
        *)0x0;
  insert_it.first.super_iterator.end.row_end._M_current =
       (sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_Alloc<std::pair<const_int,_int>,_unsigned_long,_18446744073709551615UL>_>
        *)0x0;
  insert_it.first.super_iterator.pos.row_current._M_current =
       (sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_Alloc<std::pair<const_int,_int>,_unsigned_long,_18446744073709551615UL>_>
        *)0x0;
  insert_it.first.super_iterator.pos.col_current = (nonempty_iterator)0x0;
  insert_it.first.super_iterator.pos.row_begin._M_current =
       (sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_Alloc<std::pair<const_int,_int>,_unsigned_long,_18446744073709551615UL>_>
        *)0x0;
  insert_it.first.super_iterator.pos.row_end._M_current =
       (sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_Alloc<std::pair<const_int,_int>,_unsigned_long,_18446744073709551615UL>_>
        *)0x0;
  gtest_ar__2._0_8_ = UniqueObjectHelper<std::pair<int_const,int>>(1);
  google::
  BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert((pair<google::BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_bool>
            *)&gtest_ar_,
           &this_00->
            super_BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           ,(value_type *)&gtest_ar__2);
  ppVar5 = (pair<google::BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_bool>
            *)&gtest_ar_;
  ppVar6 = &insert_it;
  for (lVar4 = 10; lVar4 != 0; lVar4 = lVar4 + -1) {
    (ppVar6->first).super_iterator.ht = (ppVar5->first).super_iterator.ht;
    ppVar5 = (pair<google::BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_bool>
              *)((long)ppVar5 + (ulong)bVar10 * -0x10 + 8);
    ppVar6 = (pair<google::BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_bool>
              *)((long)ppVar6 + (ulong)bVar10 * -0x10 + 8);
  }
  insert_it.second = local_80;
  gtest_ar__2._0_8_ = gtest_ar__2._0_8_ & 0xffffffffffffff00;
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)&gtest_ar_,"false","insert_it.second",&gtest_ar__2.success_,
             &insert_it.second);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar__2);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = *(char **)gtest_ar_.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x388,pcVar8);
    testing::internal::AssertHelper::operator=(&local_f0,(Message *)&gtest_ar__2);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    if (gtest_ar__2._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar__2._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  ppVar2 = insert_it.first.super_iterator.pos.col_current;
  pVar3 = UniqueObjectHelper<std::pair<int_const,int>>(1);
  gtest_ar__2.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  bVar9 = pVar3.second == ppVar2->second;
  bVar1 = ppVar2->first == pVar3.first;
  gtest_ar__2.success_ = bVar9 && bVar1;
  if (!bVar9 || !bVar1) {
    testing::Message::Message((Message *)&local_f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_,(internal *)&gtest_ar__2,
               (AssertionResult *)"*insert_it.first == this->UniqueObject(1)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x389,(char *)gtest_ar_._0_8_);
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_f0);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    std::__cxx11::string::~string((string *)&gtest_ar_);
    if ((long *)CONCAT44(local_f0.data_._4_4_,(int)local_f0.data_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_f0.data_._4_4_,(int)local_f0.data_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__2.message_);
  gtest_ar__2._0_8_ = UniqueObjectHelper<std::pair<int_const,int>>(2);
  google::
  BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert((pair<google::BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_bool>
            *)&gtest_ar_,
           &this_00->
            super_BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           ,(value_type *)&gtest_ar__2);
  ppVar5 = (pair<google::BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_bool>
            *)&gtest_ar_;
  ppVar6 = &insert_it;
  for (lVar4 = 10; lVar4 != 0; lVar4 = lVar4 + -1) {
    (ppVar6->first).super_iterator.ht = (ppVar5->first).super_iterator.ht;
    ppVar5 = (pair<google::BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_bool>
              *)((long)ppVar5 + (ulong)bVar10 * -0x10 + 8);
    ppVar6 = (pair<google::BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_bool>
              *)((long)ppVar6 + (ulong)bVar10 * -0x10 + 8);
  }
  gtest_ar__2.success_ = true;
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)&gtest_ar_,"true","insert_it.second",&gtest_ar__2.success_,
             &insert_it.second);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar__2);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = *(char **)gtest_ar_.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x38c,pcVar8);
    testing::internal::AssertHelper::operator=(&local_f0,(Message *)&gtest_ar__2);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    if (gtest_ar__2._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar__2._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  ppVar2 = insert_it.first.super_iterator.pos.col_current;
  pVar3 = UniqueObjectHelper<std::pair<int_const,int>>(2);
  gtest_ar__2.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  bVar9 = pVar3.second == ppVar2->second;
  bVar1 = ppVar2->first == pVar3.first;
  gtest_ar__2.success_ = bVar9 && bVar1;
  if (!bVar9 || !bVar1) {
    testing::Message::Message((Message *)&local_f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_,(internal *)&gtest_ar__2,
               (AssertionResult *)"*insert_it.first == this->UniqueObject(2)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x38d,(char *)gtest_ar_._0_8_);
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_f0);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    std::__cxx11::string::~string((string *)&gtest_ar_);
    if ((long *)CONCAT44(local_f0.data_._4_4_,(int)local_f0.data_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_f0.data_._4_4_,(int)local_f0.data_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__2.message_);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, InsertValue) {
  // First, try some straightforward insertions.
  EXPECT_TRUE(this->ht_.empty());
  this->ht_.insert(this->UniqueObject(1));
  EXPECT_FALSE(this->ht_.empty());
  this->ht_.insert(this->UniqueObject(11));
  this->ht_.insert(this->UniqueObject(111));
  this->ht_.insert(this->UniqueObject(1111));
  this->ht_.insert(this->UniqueObject(11111));
  this->ht_.insert(this->UniqueObject(111111));
  this->ht_.insert(this->UniqueObject(1111111));
  this->ht_.insert(this->UniqueObject(11111111));
  this->ht_.insert(this->UniqueObject(111111111));
  EXPECT_EQ(9u, this->ht_.size());
  EXPECT_EQ(1u, this->ht_.count(this->UniqueKey(1)));
  EXPECT_EQ(1u, this->ht_.count(this->UniqueKey(1111)));

  // Check the return type.
  pair<typename TypeParam::iterator, bool> insert_it;
  insert_it = this->ht_.insert(this->UniqueObject(1));
  EXPECT_EQ(false, insert_it.second);  // false: already present
  EXPECT_TRUE(*insert_it.first == this->UniqueObject(1));

  insert_it = this->ht_.insert(this->UniqueObject(2));
  EXPECT_EQ(true, insert_it.second);  // true: not already present
  EXPECT_TRUE(*insert_it.first == this->UniqueObject(2));
}